

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * Kvm::mulProc(Kvm *vm,Value *args)

{
  Value *pVVar1;
  long local_20;
  long result;
  Value *args_local;
  Kvm *vm_local;
  
  local_20 = 1;
  for (result = (long)args; (Value *)result != vm->NIL; result = (long)cdr((Value *)result)) {
    pVVar1 = car((Value *)result);
    local_20 = ((long)pVVar1 >> 1) * local_20;
  }
  pVVar1 = makeFixnum(vm,local_20);
  return pVVar1;
}

Assistant:

const Value* Kvm::mulProc(Kvm *vm, const Value *args)
{
    long result = 1;
    
    while (args != vm->NIL)
    {
        result *= TK_INT(car(args));
        args = cdr(args);
    }
    
    return vm->makeFixnum(result);
}